

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_view_position(element_t *element,int id,view_position_t *position)

{
  size_t sVar1;
  long lVar2;
  attribute *paVar3;
  char *it;
  attribute *paVar4;
  attribute *paVar5;
  char *pcVar6;
  attribute *paVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  undefined4 uVar9;
  char *it_1;
  long lVar10;
  size_t sVar11;
  
  for (paVar3 = element->attributes; paVar3 != (attribute *)0x0; paVar3 = paVar3->next) {
    if (paVar3->id == 0x16) {
      paVar5 = (attribute *)(paVar3->value).data;
      sVar1 = (paVar3->value).length;
      paVar3 = (attribute *)((long)&paVar5->id + sVar1);
      if ((long)sVar1 < 1) {
        pcVar6 = "none";
        paVar4 = paVar5;
        goto LAB_00106ec2;
      }
      pcVar6 = "none" + sVar1;
      sVar11 = 0;
      goto LAB_00106e9b;
    }
  }
  goto LAB_001072a2;
  while( true ) {
    if (*(char *)((long)&paVar5->id + sVar11) != "none"[sVar11]) goto LAB_00106ec7;
    sVar11 = sVar11 + 1;
    paVar4 = paVar3;
    if (sVar1 == sVar11) break;
LAB_00106e9b:
    paVar4 = (attribute *)&paVar5->field_0x4;
    if (sVar11 == 4) goto LAB_00106efb;
  }
LAB_00106ec2:
  if (*pcVar6 == '\0') {
LAB_00106efb:
    *(undefined8 *)CONCAT44(in_register_00000034,id) = 0;
  }
  else {
LAB_00106ec7:
    if ((long)sVar1 < 1) {
      pcVar6 = "xMinYMin";
      paVar4 = paVar5;
    }
    else {
      pcVar6 = "xMinYMin" + sVar1;
      sVar11 = 0;
      do {
        paVar4 = (attribute *)&paVar5->value;
        if (sVar11 == 8) goto LAB_00106f4b;
        if (*(char *)((long)&paVar5->id + sVar11) != "xMinYMin"[sVar11]) goto LAB_00106f17;
        sVar11 = sVar11 + 1;
        paVar4 = paVar3;
      } while (sVar1 != sVar11);
    }
    if (*pcVar6 == '\0') {
LAB_00106f4b:
      uVar9 = 1;
    }
    else {
LAB_00106f17:
      if ((long)sVar1 < 1) {
        pcVar6 = "xMidYMin";
        paVar4 = paVar5;
      }
      else {
        pcVar6 = "xMidYMin" + sVar1;
        sVar11 = 0;
        do {
          paVar4 = (attribute *)&paVar5->value;
          if (sVar11 == 8) goto LAB_00106f99;
          if (*(char *)((long)&paVar5->id + sVar11) != "xMidYMin"[sVar11]) goto LAB_00106f65;
          sVar11 = sVar11 + 1;
          paVar4 = paVar3;
        } while (sVar1 != sVar11);
      }
      if (*pcVar6 == '\0') {
LAB_00106f99:
        uVar9 = 2;
      }
      else {
LAB_00106f65:
        if ((long)sVar1 < 1) {
          pcVar6 = "xMaxYMin";
          paVar4 = paVar5;
        }
        else {
          pcVar6 = "xMaxYMin" + sVar1;
          sVar11 = 0;
          do {
            paVar4 = (attribute *)&paVar5->value;
            if (sVar11 == 8) goto LAB_00106fe7;
            if (*(char *)((long)&paVar5->id + sVar11) != "xMaxYMin"[sVar11]) goto LAB_00106fb3;
            sVar11 = sVar11 + 1;
            paVar4 = paVar3;
          } while (sVar1 != sVar11);
        }
        if (*pcVar6 == '\0') {
LAB_00106fe7:
          uVar9 = 3;
        }
        else {
LAB_00106fb3:
          if ((long)sVar1 < 1) {
            pcVar6 = "xMinYMid";
            paVar4 = paVar5;
          }
          else {
            pcVar6 = "xMinYMid" + sVar1;
            sVar11 = 0;
            do {
              paVar4 = (attribute *)&paVar5->value;
              if (sVar11 == 8) goto LAB_00107035;
              if (*(char *)((long)&paVar5->id + sVar11) != "xMinYMid"[sVar11]) goto LAB_00107001;
              sVar11 = sVar11 + 1;
              paVar4 = paVar3;
            } while (sVar1 != sVar11);
          }
          if (*pcVar6 == '\0') {
LAB_00107035:
            uVar9 = 4;
          }
          else {
LAB_00107001:
            if ((long)sVar1 < 1) {
              pcVar6 = "xMidYMid";
              paVar4 = paVar5;
            }
            else {
              pcVar6 = "xMidYMid" + sVar1;
              sVar11 = 0;
              do {
                paVar4 = (attribute *)&paVar5->value;
                if (sVar11 == 8) goto LAB_00107083;
                if (*(char *)((long)&paVar5->id + sVar11) != "xMidYMid"[sVar11]) goto LAB_0010704f;
                sVar11 = sVar11 + 1;
                paVar4 = paVar3;
              } while (sVar1 != sVar11);
            }
            if (*pcVar6 == '\0') {
LAB_00107083:
              uVar9 = 5;
            }
            else {
LAB_0010704f:
              if ((long)sVar1 < 1) {
                pcVar6 = "xMaxYMid";
                paVar4 = paVar5;
              }
              else {
                pcVar6 = "xMaxYMid" + sVar1;
                sVar11 = 0;
                do {
                  paVar4 = (attribute *)&paVar5->value;
                  if (sVar11 == 8) goto LAB_001070d1;
                  if (*(char *)((long)&paVar5->id + sVar11) != "xMaxYMid"[sVar11])
                  goto LAB_0010709d;
                  sVar11 = sVar11 + 1;
                  paVar4 = paVar3;
                } while (sVar1 != sVar11);
              }
              if (*pcVar6 == '\0') {
LAB_001070d1:
                uVar9 = 6;
              }
              else {
LAB_0010709d:
                if ((long)sVar1 < 1) {
                  pcVar6 = "xMinYMax";
                  paVar4 = paVar5;
                }
                else {
                  pcVar6 = "xMinYMax" + sVar1;
                  sVar11 = 0;
                  do {
                    paVar4 = (attribute *)&paVar5->value;
                    if (sVar11 == 8) goto LAB_0010711f;
                    if (*(char *)((long)&paVar5->id + sVar11) != "xMinYMax"[sVar11])
                    goto LAB_001070eb;
                    sVar11 = sVar11 + 1;
                    paVar4 = paVar3;
                  } while (sVar1 != sVar11);
                }
                if (*pcVar6 == '\0') {
LAB_0010711f:
                  uVar9 = 7;
                }
                else {
LAB_001070eb:
                  if ((long)sVar1 < 1) {
                    pcVar6 = "xMidYMax";
                    paVar4 = paVar5;
                  }
                  else {
                    pcVar6 = "xMidYMax" + sVar1;
                    sVar11 = 0;
                    do {
                      paVar4 = (attribute *)&paVar5->value;
                      if (sVar11 == 8) goto LAB_0010716e;
                      if (*(char *)((long)&paVar5->id + sVar11) != "xMidYMax"[sVar11])
                      goto LAB_00107136;
                      sVar11 = sVar11 + 1;
                      paVar4 = paVar3;
                    } while (sVar1 != sVar11);
                  }
                  if (*pcVar6 == '\0') {
LAB_0010716e:
                    uVar9 = 8;
                  }
                  else {
LAB_00107136:
                    if ((long)sVar1 < 1) {
                      pcVar6 = "xMaxYMax";
                      paVar7 = paVar5;
                    }
                    else {
                      pcVar6 = "xMaxYMax" + sVar1;
                      paVar4 = (attribute *)&paVar5->value;
                      sVar11 = 0;
                      do {
                        if (sVar11 == 8) {
                          uVar9 = 9;
                          goto LAB_00107195;
                        }
                        if (*(char *)((long)&paVar5->id + sVar11) != "xMaxYMax"[sVar11])
                        goto LAB_001072a2;
                        sVar11 = sVar11 + 1;
                        paVar7 = paVar3;
                      } while (sVar1 != sVar11);
                    }
                    paVar4 = paVar7;
                    if (*pcVar6 != '\0') goto LAB_001072a2;
                    uVar9 = 9;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00107195:
    *(undefined4 *)CONCAT44(in_register_00000034,id) = uVar9;
    *(undefined4 *)(CONCAT44(in_register_00000034,id) + 4) = 0;
    paVar5 = paVar4;
    if (paVar4 < paVar3) {
      do {
        uVar8 = (ulong)(byte)paVar4->id;
        paVar5 = paVar4;
        if ((0x20 < uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) break;
        paVar4 = (attribute *)((long)&paVar4->id + 1);
        paVar5 = paVar3;
      } while (paVar4 != paVar3);
    }
    if (paVar5 < paVar3) {
      pcVar6 = "meet" + ((long)paVar3 - (long)paVar5);
      lVar10 = 0;
      do {
        paVar4 = (attribute *)&paVar5->field_0x4;
        if (lVar10 == 4) goto LAB_0010727b;
        if (*(char *)((long)&paVar5->id + lVar10) != "meet"[lVar10]) goto LAB_0010721a;
        lVar2 = lVar10 + 1;
        lVar10 = lVar10 + 1;
        paVar4 = paVar3;
      } while ((attribute *)((long)&paVar5->id + lVar2) != paVar3);
    }
    else {
      pcVar6 = "meet";
      paVar4 = paVar5;
    }
    if (*pcVar6 != '\0') {
LAB_0010721a:
      if (paVar5 < paVar3) {
        pcVar6 = "slice" + ((long)paVar3 - (long)paVar5);
        lVar10 = 0;
        do {
          paVar7 = (attribute *)&paVar5->field_0x5;
          if (lVar10 == 5) goto LAB_0010726c;
          paVar4 = paVar5;
          if (*(char *)((long)&paVar5->id + lVar10) != "slice"[lVar10]) goto LAB_0010727b;
          lVar2 = lVar10 + 1;
          lVar10 = lVar10 + 1;
          paVar7 = paVar3;
        } while ((attribute *)((long)&paVar5->id + lVar2) != paVar3);
      }
      else {
        pcVar6 = "slice";
        paVar7 = paVar5;
      }
      paVar4 = paVar5;
      if (*pcVar6 == '\0') {
LAB_0010726c:
        *(undefined4 *)(CONCAT44(in_register_00000034,id) + 4) = 1;
        paVar4 = paVar7;
      }
    }
  }
LAB_0010727b:
  if (paVar4 < paVar3) {
    do {
      uVar8 = (ulong)(byte)paVar4->id;
      if ((0x20 < uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) break;
      paVar4 = (attribute *)((long)&paVar4->id + 1);
    } while (paVar4 != paVar3);
  }
LAB_001072a2:
  return SUB81(paVar3,0);
}

Assistant:

static bool parse_view_position(const element_t* element, int id, view_position_t* position)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none"))
        position->align = view_align_none;
    else if(skip_string(&it, end, "xMinYMin"))
        position->align = view_align_x_min_y_min;
    else if(skip_string(&it, end, "xMidYMin"))
        position->align = view_align_x_mid_y_min;
    else if(skip_string(&it, end, "xMaxYMin"))
        position->align = view_align_x_max_y_min;
    else if(skip_string(&it, end, "xMinYMid"))
        position->align = view_align_x_min_y_mid;
    else if(skip_string(&it, end, "xMidYMid"))
        position->align = view_align_x_mid_y_mid;
    else if(skip_string(&it, end, "xMaxYMid"))
        position->align = view_align_x_max_y_mid;
    else if(skip_string(&it, end, "xMinYMax"))
        position->align = view_align_x_min_y_max;
    else if(skip_string(&it, end, "xMidYMax"))
        position->align = view_align_x_mid_y_max;
    else if(skip_string(&it, end, "xMaxYMax"))
        position->align = view_align_x_max_y_max;
    else
        return false;
    position->scale = view_scale_meet;
    if(position->align != view_align_none) {
        skip_ws(&it, end);
        if(skip_string(&it, end, "meet"))
            position->scale = view_scale_meet;
        else if(skip_string(&it, end, "slice")) {
            position->scale = view_scale_slice;
        }
    }

    return !skip_ws(&it, end);
}